

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::create_directory(path *p)

{
  error_category *p_00;
  bool bVar1;
  int code;
  filesystem_error *this;
  error_code ec_00;
  string local_68;
  path local_48;
  byte local_21;
  undefined1 auStack_20 [7];
  bool result;
  error_code ec;
  path *p_local;
  
  ec._M_cat = (error_category *)p;
  std::error_code::error_code((error_code *)auStack_20);
  p_00 = ec._M_cat;
  path::path(&local_48);
  bVar1 = create_directory((path *)p_00,&local_48,(error_code *)auStack_20);
  path::~path(&local_48);
  local_21 = bVar1;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_20);
  if (!bVar1) {
    return (bool)(local_21 & 1);
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_20);
  detail::systemErrorText<int>(&local_68,code);
  ec_00._0_8_ = _auStack_20 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_68,(path *)ec._M_cat,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool create_directory(const path& p)
{
    std::error_code ec;
    auto result = create_directory(p, path(), ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}